

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O2

DdNode * cuddBddMakePrime(DdManager *dd,DdNode *cube,DdNode *f)

{
  int iVar1;
  DdNode *n;
  DdNode *node;
  DdNode *pDVar2;
  DdNode *e;
  DdNode *t;
  DdNode *local_40;
  DdNode *local_38;
  
  pDVar2 = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(cube);
  node = cube;
  do {
    if ((ulong)*(uint *)((ulong)cube & 0xfffffffffffffffe) == 0x7fffffff) {
      if (cube == dd->one) {
        Cudd_Deref(node);
        return node;
      }
      break;
    }
    n = Cudd_bddExistAbstract(dd,node,dd->vars[*(uint *)((ulong)cube & 0xfffffffffffffffe)]);
    if (n == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    Cudd_Ref(n);
    iVar1 = Cudd_bddLeq(dd,n,f);
    if (iVar1 == 0) {
      Cudd_RecursiveDeref(dd,n);
    }
    else {
      Cudd_RecursiveDeref(dd,node);
      node = n;
    }
    cuddGetBranches(cube,&local_38,&local_40);
    cube = local_40;
  } while ((local_38 == pDVar2) || (cube = local_38, local_40 == pDVar2));
  Cudd_RecursiveDeref(dd,node);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddMakePrime(
  DdManager *dd /* manager */,
  DdNode *cube /* cube to be expanded */,
  DdNode *f /* function of which the cube is to be made a prime */)
{
    DdNode *scan;
    DdNode *t, *e;
    DdNode *res = cube;
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    Cudd_Ref(res);
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        DdNode *reg = Cudd_Regular(scan);
        DdNode *var = dd->vars[reg->index];
        DdNode *expanded = Cudd_bddExistAbstract(dd,res,var);
        if (expanded == NULL) {
            return(NULL);
        }
        Cudd_Ref(expanded);
        if (Cudd_bddLeq(dd,expanded,f)) {
            Cudd_RecursiveDeref(dd,res);
            res = expanded;
        } else {
            Cudd_RecursiveDeref(dd,expanded);
        }
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            scan = e;
        } else if (e == zero) {
            scan = t;
        } else {
            Cudd_RecursiveDeref(dd,res);
            return(NULL);       /* cube is not a cube */
        }
    }

    if (scan == DD_ONE(dd)) {
        Cudd_Deref(res);
        return(res);
    } else {
        Cudd_RecursiveDeref(dd,res);
        return(NULL);
    }

}